

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size,int isBlank)

{
  xmlChar xVar1;
  _xmlSAXHandler *p_Var2;
  xmlDocPtr pxVar3;
  ignorableWhitespaceSAXFunc UNRECOVERED_JUMPTABLE;
  charactersSAXFunc p_Var4;
  xmlNode *node;
  bool bVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  xmlNodePtr pxVar9;
  ulong uVar10;
  _xmlDtd *p_Var11;
  xmlDocPtr doc;
  xmlChar *pxVar12;
  bool bVar13;
  
  p_Var2 = ctxt->sax;
  if (p_Var2 == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if (ctxt->keepBlanks == 0) {
    bVar13 = true;
  }
  else {
    bVar13 = p_Var2->ignorableWhitespace != p_Var2->characters;
  }
  if (!bVar13) goto LAB_0013f5e1;
  if (((ctxt->space == (int *)0x0) || (iVar6 = *ctxt->space, iVar6 == -2)) || (iVar6 == 1)) {
LAB_0013f5a2:
    iVar6 = 0;
  }
  else {
    if (0 < size && isBlank == 0) {
      uVar10 = 0;
      do {
        if ((0x20 < (ulong)buf[uVar10]) || ((0x100002600U >> ((ulong)buf[uVar10] & 0x3f) & 1) == 0))
        goto LAB_0013f5a2;
        uVar10 = uVar10 + 1;
      } while ((uint)size != uVar10);
    }
    pxVar9 = ctxt->node;
    if (pxVar9 == (xmlNodePtr)0x0) goto LAB_0013f5a2;
    pxVar3 = ctxt->myDoc;
    if (pxVar3 == (xmlDocPtr)0x0) {
LAB_0013f559:
      pxVar12 = ctxt->input->cur;
      xVar1 = *pxVar12;
      if (((xVar1 != '<') && (xVar1 != '\r')) ||
         ((xVar1 == '<' && ((ctxt->node->children == (_xmlNode *)0x0 && (pxVar12[1] == '/'))))))
      goto LAB_0013f5a2;
      pxVar9 = xmlGetLastChild(ctxt->node);
      if (pxVar9 == (xmlNodePtr)0x0) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
           (iVar6 = 0, ctxt->node->content != (xmlChar *)0x0)) goto LAB_0013f5a4;
      }
      else {
        iVar6 = xmlNodeIsText(pxVar9);
        if (iVar6 != 0) goto LAB_0013f5a2;
        node = ctxt->node->children;
        if (node != (xmlNode *)0x0) {
          iVar7 = xmlNodeIsText(node);
          iVar6 = 0;
          if (iVar7 != 0) goto LAB_0013f5a4;
        }
      }
      iVar6 = 1;
    }
    else {
      if (pxVar9->ns == (xmlNs *)0x0) {
        pxVar12 = (xmlChar *)0x0;
      }
      else {
        pxVar12 = pxVar9->ns->prefix;
      }
      p_Var11 = pxVar3->intSubset;
      if (p_Var11 == (_xmlDtd *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = xmlHashLookup2((xmlHashTablePtr)p_Var11->elements,pxVar9->name,pxVar12);
      }
      iVar6 = (int)p_Var11;
      if (pvVar8 == (void *)0x0) {
        if (pxVar3->extSubset == (_xmlDtd *)0x0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = xmlHashLookup2((xmlHashTablePtr)pxVar3->extSubset->elements,ctxt->node->name,
                                  pxVar12);
        }
      }
      if (pvVar8 == (void *)0x0) {
LAB_0013f553:
        bVar5 = true;
      }
      else {
        iVar6 = 0;
        if (1 < *(int *)((long)pvVar8 + 0x48) - 2U) {
          if (*(int *)((long)pvVar8 + 0x48) != 4) goto LAB_0013f553;
          iVar6 = 1;
        }
        bVar5 = false;
      }
      if (bVar5) goto LAB_0013f559;
    }
  }
LAB_0013f5a4:
  if (iVar6 != 0) {
    UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
    if (UNRECOVERED_JUMPTABLE == (ignorableWhitespaceSAXFunc)0x0) {
      return;
    }
    if (ctxt->keepBlanks == 0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
    return;
  }
LAB_0013f5e1:
  p_Var4 = ctxt->sax->characters;
  if (p_Var4 != (charactersSAXFunc)0x0) {
    (*p_Var4)(ctxt->userData,buf,size);
  }
  if ((bVar13) && (*ctxt->space == -1)) {
    *ctxt->space = -2;
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size,
              int isBlank) {
    int checkBlanks;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    checkBlanks = (!ctxt->keepBlanks) ||
                  (ctxt->sax->ignorableWhitespace != ctxt->sax->characters);

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((checkBlanks) &&
        (areBlanks(ctxt, buf, size, isBlank))) {
        if ((ctxt->sax->ignorableWhitespace != NULL) &&
            (ctxt->keepBlanks))
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if checkBlanks was false. This was probably a bug.
         */
        if ((checkBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}